

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolutionDebug.cpp
# Opt level: O3

HighsDebugStatus
debugCompareHighsInfo(HighsOptions *options,HighsInfo *highs_info0,HighsInfo *highs_info1)

{
  HighsDebugStatus HVar1;
  HighsDebugStatus HVar2;
  
  HVar1 = debugCompareHighsInfoObjective(options,highs_info0,highs_info1);
  HVar1 = debugWorseStatus(HVar1,kOk);
  HVar2 = debugCompareHighsInfoStatus(options,highs_info0,highs_info1);
  HVar1 = debugWorseStatus(HVar2,HVar1);
  HVar2 = debugCompareHighsInfoInfeasibility(options,highs_info0,highs_info1);
  HVar1 = debugWorseStatus(HVar2,HVar1);
  return HVar1;
}

Assistant:

HighsDebugStatus debugCompareHighsInfo(const HighsOptions& options,
                                       const HighsInfo& highs_info0,
                                       const HighsInfo& highs_info1) {
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  return_status = debugWorseStatus(
      debugCompareHighsInfoObjective(options, highs_info0, highs_info1),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoStatus(options, highs_info0, highs_info1),
      return_status);
  return_status = debugWorseStatus(
      debugCompareHighsInfoInfeasibility(options, highs_info0, highs_info1),
      return_status);
  return return_status;
}